

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfunc.cpp
# Opt level: O0

void __thiscall trun::TestFunc::PrintTestResult(TestFunc *this)

{
  kTestResult kVar1;
  kFailState kVar2;
  uint uVar3;
  int iVar4;
  element_type *peVar5;
  string *psVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  double dVar10;
  double tElapsedSec;
  TestFunc *this_local;
  
  peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->testResult);
  dVar10 = TestResult::ElapsedTimeSec(peVar5);
  peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->testResult);
  kVar1 = TestResult::Result(peVar5);
  if (kVar1 == kTestResult_Pass) {
    peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->testResult);
    iVar4 = TestResult::Errors(peVar5);
    if (iVar4 == 0) {
      peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->testResult);
      sVar8 = TestResult::Asserts(peVar5);
      if (sVar8 == 0) {
        peVar5 = std::
                 __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->testResult);
        psVar6 = TestResult::SymbolName_abi_cxx11_(peVar5);
        pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str(psVar6);
        peVar5 = std::
                 __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->testResult);
        kVar1 = TestResult::Result(peVar5);
        printf("=== PASS:\t%s, %.3f sec, %d\n",dVar10,pcVar7,(ulong)kVar1);
        goto LAB_001558b4;
      }
    }
    peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->testResult);
    psVar6 = TestResult::SymbolName_abi_cxx11_(peVar5);
    pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (psVar6);
    peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->testResult);
    kVar1 = TestResult::Result(peVar5);
    peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->testResult);
    uVar3 = TestResult::Errors(peVar5);
    peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->testResult);
    sVar8 = TestResult::Asserts(peVar5);
    printf("=== FAIL:\t%s, %.3f sec, %d, %d, %zu\n",dVar10,pcVar7,(ulong)kVar1,(ulong)uVar3,sVar8);
  }
  else {
    peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->testResult);
    kVar1 = TestResult::Result(peVar5);
    if (kVar1 == kTestResult_InvalidReturnCode) {
      peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->testResult);
      kVar1 = TestResult::Result(peVar5);
      peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->testResult);
      psVar6 = TestResult::SymbolName_abi_cxx11_(peVar5);
      pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(psVar6);
      printf("=== INVALID RETURN CODE (%d) for %s",(ulong)kVar1,pcVar7);
    }
    else {
      peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->testResult);
      kVar2 = TestResult::FailState(peVar5);
      if (kVar2 == Main) {
        peVar5 = std::
                 __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->testResult);
        psVar6 = TestResult::SymbolName_abi_cxx11_(peVar5);
        pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str(psVar6);
        peVar5 = std::
                 __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->testResult);
        kVar1 = TestResult::Result(peVar5);
        peVar5 = std::
                 __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->testResult);
        uVar3 = TestResult::Errors(peVar5);
        peVar5 = std::
                 __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->testResult);
        sVar8 = TestResult::Asserts(peVar5);
        printf("=== FAIL:\t%s, %.3f sec, %d, %d, %zu\n",dVar10,pcVar7,(ulong)kVar1,(ulong)uVar3,
               sVar8);
      }
      else {
        peVar5 = std::
                 __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->testResult);
        psVar6 = TestResult::SymbolName_abi_cxx11_(peVar5);
        pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str(psVar6);
        peVar5 = std::
                 __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->testResult);
        psVar6 = TestResult::FailStateName_abi_cxx11_(peVar5);
        pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str(psVar6);
        peVar5 = std::
                 __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->testResult);
        kVar1 = TestResult::Result(peVar5);
        peVar5 = std::
                 __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->testResult);
        uVar3 = TestResult::Errors(peVar5);
        peVar5 = std::
                 __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->testResult);
        sVar8 = TestResult::Asserts(peVar5);
        printf("=== FAIL:\t%s (%s), %.3f sec, %d, %d, %zu\n",dVar10,pcVar7,pcVar9,(ulong)kVar1,
               (ulong)uVar3,sVar8);
      }
    }
  }
LAB_001558b4:
  printf("\n");
  return;
}

Assistant:

void TestFunc::PrintTestResult() {
    double tElapsedSec = testResult->ElapsedTimeSec();
    if (testResult->Result() != kTestResult_Pass) {
        if (testResult->Result() == kTestResult_InvalidReturnCode) {

            printf("=== INVALID RETURN CODE (%d) for %s", testResult->Result(), testResult->SymbolName().c_str());
        } else {
            //std::string failState = testResult->FailState() == TestResult::kFailState::PreHook?"pre-hook"
            if (testResult->FailState() == TestResult::kFailState::Main) {
                printf("=== FAIL:\t%s, %.3f sec, %d, %d, %zu\n", testResult->SymbolName().c_str(), tElapsedSec,
                       testResult->Result(), testResult->Errors(), testResult->Asserts());
            } else {
                printf("=== FAIL:\t%s (%s), %.3f sec, %d, %d, %zu\n",
                       testResult->SymbolName().c_str(),
                       testResult->FailStateName().c_str(),
                       tElapsedSec,
                       testResult->Result(), testResult->Errors(), testResult->Asserts());
            }
        }
    } else {
        if ((testResult->Errors() != 0) || (testResult->Asserts() != 0)) {
            printf("=== FAIL:\t%s, %.3f sec, %d, %d, %zu\n",testResult->SymbolName().c_str(), tElapsedSec, testResult->Result(), testResult->Errors(), testResult->Asserts());
        } else {
            printf("=== PASS:\t%s, %.3f sec, %d\n",testResult->SymbolName().c_str(),tElapsedSec, testResult->Result());
        }
    }
    printf("\n");
}